

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall R2Rect::AddRect(R2Rect *this,R2Rect *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  VType VVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  dVar1 = other->bounds_[0].bounds_.c_[0];
  dVar2 = other->bounds_[0].bounds_.c_[1];
  uVar5 = SUB84(dVar2,0);
  uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
  if (dVar1 <= dVar2) {
    dVar2 = this->bounds_[0].bounds_.c_[0];
    dVar3 = this->bounds_[0].bounds_.c_[1];
    if (dVar2 <= dVar3) {
      if (dVar1 < dVar2) {
        this->bounds_[0].bounds_.c_[0] = dVar1;
        VVar4 = other->bounds_[0].bounds_.c_[1];
        uVar5 = SUB84(VVar4,0);
        uVar6 = (undefined4)((ulong)VVar4 >> 0x20);
      }
      if (dVar3 <= (double)CONCAT44(uVar6,uVar5) && (double)CONCAT44(uVar6,uVar5) != dVar3) {
        this->bounds_[0].bounds_.c_[1] = (VType)CONCAT44(uVar6,uVar5);
      }
    }
    else {
      VVar4 = other->bounds_[0].bounds_.c_[1];
      this->bounds_[0].bounds_.c_[0] = other->bounds_[0].bounds_.c_[0];
      this->bounds_[0].bounds_.c_[1] = VVar4;
    }
  }
  dVar1 = other->bounds_[1].bounds_.c_[0];
  dVar2 = other->bounds_[1].bounds_.c_[1];
  uVar5 = SUB84(dVar2,0);
  uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
  if (dVar1 <= dVar2) {
    dVar2 = this->bounds_[1].bounds_.c_[0];
    dVar3 = this->bounds_[1].bounds_.c_[1];
    if (dVar3 < dVar2) {
      VVar4 = other->bounds_[1].bounds_.c_[1];
      this->bounds_[1].bounds_.c_[0] = other->bounds_[1].bounds_.c_[0];
      this->bounds_[1].bounds_.c_[1] = VVar4;
      return;
    }
    if (dVar1 < dVar2) {
      this->bounds_[1].bounds_.c_[0] = dVar1;
      VVar4 = other->bounds_[1].bounds_.c_[1];
      uVar5 = SUB84(VVar4,0);
      uVar6 = (undefined4)((ulong)VVar4 >> 0x20);
    }
    if (dVar3 <= (double)CONCAT44(uVar6,uVar5) && (double)CONCAT44(uVar6,uVar5) != dVar3) {
      this->bounds_[1].bounds_.c_[1] = (VType)CONCAT44(uVar6,uVar5);
      return;
    }
  }
  return;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }